

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = testnohook();
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Success");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return iVar1;
}

Assistant:

int main()
{
  int failure =
#if MOCKARON_DISABLE_HOOKS
    testnohook();
#else
    test();
#endif

  if (!failure)
    std::cerr << "Success" << std::endl;

  return failure;
}